

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

Definition * __thiscall
slang::ast::Compilation::getDefinition(Compilation *this,ModuleDeclarationSyntax *syntax)

{
  EntryPointer psVar1;
  EntryPointer psVar2;
  size_t sVar3;
  _Head_base<0UL,_slang::ast::Definition_*,_false> _Var4;
  EntryPointer psVar5;
  long lVar6;
  long lVar7;
  
  psVar2 = (this->definitionMap).
           super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
           .entries;
  psVar5 = psVar2 + -1;
  lVar6 = 0x28;
  do {
    lVar6 = lVar6 + -0x28;
    psVar1 = psVar5 + 1;
    psVar5 = psVar5 + 1;
  } while (psVar1->distance_from_desired < '\0');
  sVar3 = (this->definitionMap).
          super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
          .num_slots_minus_one;
  lVar7 = (long)(this->definitionMap).
                super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
                .max_lookups;
  if (sVar3 * 0x28 + lVar7 * 0x28 + lVar6 != 0) {
    do {
      _Var4._M_head_impl =
           *(Definition **)
            &(psVar5->field_1).value.second._M_t.
             super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
      ;
      if ((_Var4._M_head_impl)->syntax == syntax) {
        return _Var4._M_head_impl;
      }
      do {
        psVar1 = psVar5 + 1;
        psVar5 = psVar5 + 1;
      } while (psVar1->distance_from_desired < '\0');
    } while (psVar5 != psVar2 + sVar3 + lVar7);
  }
  return (Definition *)0x0;
}

Assistant:

const_iterator begin() const
    {
        for (EntryPointer it = entries;; ++it)
        {
            if (it->has_value())
                return { it };
        }
    }